

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecPOMDP.cpp
# Opt level: O2

string * __thiscall DecPOMDP::SoftPrint_abi_cxx11_(string *__return_storage_ptr__,DecPOMDP *this)

{
  ostream *poVar1;
  stringstream ss;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(local_190,"Discount factor: ");
  poVar1 = std::ostream::_M_insert<double>(this->_m_discount);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(local_190,"Reward type: ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->_m_rewardType);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

string DecPOMDP::SoftPrint() const
{
    stringstream ss;
    ss << "Discount factor: " << _m_discount << endl;
    ss << "Reward type: " << _m_rewardType << endl;
    return ss.str();
}